

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O3

void __thiscall wasm::CodeFolding::visitIf(CodeFolding *this,If *curr)

{
  Id IVar1;
  Block *left;
  Module *left_00;
  pointer puVar2;
  size_t sVar3;
  bool bVar4;
  Block *pBVar5;
  initializer_list<wasm::CodeFolding::Tail> __l;
  Builder local_78;
  Builder builder;
  undefined1 local_48 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> tails;
  
  left = (Block *)curr->ifFalse;
  if ((left != (Block *)0x0) && ((curr->condition->type).id != 1)) {
    left_00 = (Module *)curr->ifTrue;
    builder.wasm = (Module *)0x0;
    if (*(Id *)&(left_00->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == BlockId) {
      builder.wasm = left_00;
    }
    IVar1 = (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id;
    if ((IVar1 == BlockId) || (builder.wasm == (Module *)0x0)) {
      pBVar5 = (Block *)0x0;
      if ((IVar1 == BlockId) && (pBVar5 = left, builder.wasm == (Module *)0x0)) {
        sVar3 = (left->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        if (sVar3 == 0) {
          return;
        }
        bVar4 = ExpressionAnalyzer::equal
                          ((Expression *)left_00,
                           (left->list).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .data[sVar3 - 1]);
        if (!bVar4) {
          return;
        }
        local_78.wasm =
             (this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
             ).
             super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
             .
             super_PostWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
             .
             super_Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
             .currModule;
        builder.wasm = (Module *)Builder::makeBlock(&stack0xffffffffffffff88,curr->ifTrue);
        curr->ifTrue = (Expression *)builder.wasm;
      }
    }
    else {
      puVar2 = ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (puVar2 == (pointer)0x0) {
        return;
      }
      bVar4 = ExpressionAnalyzer::equal
                        ((Expression *)left,
                         (Expression *)
                         ((builder.wasm)->functions).
                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish
                         [(long)((long)&puVar2[-1]._M_t.
                                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                                + 7)]._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      if (!bVar4) {
        return;
      }
      local_78.wasm =
           (this->
           super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
           ).
           super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
           .
           super_PostWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
           .
           super_Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
           .currModule;
      pBVar5 = Builder::makeBlock(&stack0xffffffffffffff88,curr->ifFalse);
      curr->ifFalse = (Expression *)pBVar5;
      builder.wasm = left_00;
    }
    if ((((pBVar5 != (Block *)0x0) && (builder.wasm != (Module *)0x0)) &&
        (((builder.wasm)->functions).
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)) &&
       ((pBVar5->name).super_IString.str._M_str == (char *)0x0)) {
      local_78.wasm = (Module *)0x0;
      __l._M_len = 2;
      __l._M_array = (iterator)&stack0xffffffffffffff88;
      std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
                ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                 local_48,__l,
                 (allocator_type *)
                 ((long)&tails.
                         super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      optimizeExpressionTails<wasm::If>
                (this,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                      local_48,curr);
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48,
                        (long)tails.
                              super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_48);
      }
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (!curr->ifFalse) {
      return;
    }
    if (curr->condition->type == Type::unreachable) {
      // If the arms are foldable and concrete, we would be replacing an
      // unreachable If with a concrete block, which may or may not be valid,
      // depending on the context. Leave this for DCE rather than trying to
      // handle that.
      return;
    }
    // If both are blocks, look for a tail we can merge.
    auto* left = curr->ifTrue->dynCast<Block>();
    auto* right = curr->ifFalse->dynCast<Block>();
    // If one is a block and the other isn't, and the non-block is a tail of the
    // other, we can fold that - for our convenience, we just add a block and
    // run the rest of the optimization mormally.
    auto maybeAddBlock = [this](Block* block, Expression*& other) -> Block* {
      // If other is a suffix of the block, wrap it in a block.
      if (block->list.empty() ||
          !ExpressionAnalyzer::equal(other, block->list.back())) {
        return nullptr;
      }
      // Do it, assign to the out param `other`, and return the block.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(other);
      other = ret;
      return ret;
    };
    if (left && !right) {
      right = maybeAddBlock(left, curr->ifFalse);
    } else if (!left && right) {
      left = maybeAddBlock(right, curr->ifTrue);
    }
    // We need nameless blocks, as if there is a name, someone might branch to
    // the end, skipping the code we want to merge.
    if (left && right && !left->name.is() && !right->name.is()) {
      std::vector<Tail> tails = {Tail(left), Tail(right)};
      optimizeExpressionTails(tails, curr);
    }
  }